

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_add_srv_req(raft_server *this,req_msg *req)

{
  int32 *__rwlock;
  ulong uVar1;
  int iVar2;
  element_type *peVar3;
  pointer psVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  peer *ppVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  size_t sVar10;
  runtime_error *this_00;
  long in_RDX;
  ulong uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  long *plVar13;
  long *plVar14;
  bool bVar15;
  ptr<resp_msg> pVar16;
  undefined1 auVar17 [16];
  executor exec;
  undefined1 local_149;
  peer *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  undefined1 local_138 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  _Any_data local_108;
  req_msg local_f8 [2];
  char *local_40;
  
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->_vptr_raft_server = (_func_int **)0x0;
  puVar9 = (undefined8 *)operator_new(0x40);
  puVar9[1] = 0x100000001;
  *puVar9 = &PTR___Sp_counted_ptr_inplace_0017a728;
  puVar9[2] = &PTR__msg_base_00178628;
  puVar9[3] = peVar3;
  *(undefined4 *)(puVar9 + 4) = 7;
  uVar1 = (req->super_msg_base).term_;
  *(ulong *)((long)puVar9 + 0x24) = CONCAT44((int)uVar1,(int)(uVar1 >> 0x20));
  puVar9[2] = &PTR__msg_base_0017a778;
  puVar9[6] = 0;
  *(undefined1 *)(puVar9 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar9;
  this->_vptr_raft_server = (_func_int **)(puVar9 + 2);
  plVar13 = *(long **)(in_RDX + 0x38);
  if ((*(long *)(in_RDX + 0x40) - (long)plVar13 == 0x10) && (*(int *)(*plVar13 + 8) == 3)) {
    if (*(int *)&req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 3) {
      if (*(buffer **)(*plVar13 + 0x18) == (buffer *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"get_buf cannot be called for a log_entry with nil buffer");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      srv_config::deserialize((srv_config *)(local_138 + 0x10),*(buffer **)(*plVar13 + 0x18));
      __rwlock = &req[2].super_msg_base.dst_;
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)__rwlock);
      iVar2 = *(int *)(_func_int ***)local_138._16_8_;
      psVar4 = req[1].log_entries_.
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (ulong)(long)iVar2 % (ulong)psVar4;
      plVar13 = *(long **)(req[1].commit_idx_ + uVar11 * 8);
      plVar14 = (long *)0x0;
      if ((plVar13 != (long *)0x0) &&
         (plVar5 = (long *)*plVar13, plVar14 = plVar13, iVar2 != *(int *)((long *)*plVar13 + 1))) {
        while (plVar13 = plVar5, plVar5 = (long *)*plVar13, plVar5 != (long *)0x0) {
          plVar14 = (long *)0x0;
          if (((ulong)(long)(int)plVar5[1] % (ulong)psVar4 != uVar11) ||
             (plVar14 = plVar13, iVar2 == (int)plVar5[1])) goto LAB_0014e878;
        }
        plVar14 = (long *)0x0;
      }
LAB_0014e878:
      if (plVar14 == (long *)0x0) {
        bVar15 = false;
      }
      else {
        bVar15 = *plVar14 != 0;
      }
      if ((bool)(*(int *)((long)&(req->super_msg_base).term_ + 4) == iVar2 | bVar15)) {
        plVar13 = (long *)req[4].last_log_term_;
        local_40 = "the server to be added has a duplicated id with existing server %d";
        local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__rwlock;
        snprintf(local_108._M_pod_data,200,
                 "the server to be added has a duplicated id with existing server %d",
                 (ulong)*(uint *)(_func_int ***)local_138._16_8_);
        local_148 = (peer *)local_138;
        sVar10 = strlen(local_108._M_pod_data);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,&local_108,(long)local_f8 + (sVar10 - 0x10));
        (**(code **)(*plVar13 + 0x20))(plVar13,&local_148);
        _Var12._M_pi = local_110._M_pi;
        if (local_148 != (peer *)local_138) {
          operator_delete(local_148,(ulong)((long)(int32 *)local_138._0_8_ + 1));
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)_Var12._M_pi);
        _Var12._M_pi = extraout_RDX_02;
        if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
          _Var12._M_pi = extraout_RDX_03;
        }
      }
      else {
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        _Var12._M_pi = _Stack_120._M_pi;
        uVar8 = local_138._16_8_;
        if (*(char *)((long)&req->last_log_idx_ + 1) == '\x01') {
          plVar13 = (long *)req[4].last_log_term_;
          local_108._M_unused._M_object = local_f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_108,"previous config has not committed yet","");
          (**(code **)(*plVar13 + 0x18))(plVar13,&local_108);
          _Var12._M_pi = extraout_RDX_04;
          if ((req_msg *)local_108._M_unused._0_8_ != local_f8) {
            operator_delete(local_108._M_unused._M_object,
                            (ulong)((long)local_f8[0].super_msg_base._vptr_msg_base + 1));
            _Var12._M_pi = extraout_RDX_05;
          }
        }
        else {
          local_138._16_8_ = (element_type *)0x0;
          _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)req[5].last_log_idx_;
          req[5].last_log_term_ = uVar8;
          req[5].last_log_idx_ = (ulong)_Var12._M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          local_108._8_4_ = 0;
          local_108._12_4_ = 0;
          local_f8[0].super_msg_base.term_ =
               (ulong)std::
                      _Function_handler<void_(cornerstone::peer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_req_handlers.cxx:507:40)>
                      ::_M_invoke;
          local_f8[0].super_msg_base._vptr_msg_base =
               (_func_int **)
               std::
               _Function_handler<void_(cornerstone::peer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_req_handlers.cxx:507:40)>
               ::_M_manager;
          local_148 = (peer *)0x0;
          local_108._M_unused._M_object = req;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<cornerstone::peer,std::allocator<cornerstone::peer>,std::shared_ptr<cornerstone::srv_config>&,cornerstone::context&,std::function<void(cornerstone::peer&)>&>
                    (&_Stack_140,&local_148,(allocator<cornerstone::peer> *)&local_149,
                     (shared_ptr<cornerstone::srv_config> *)&req[5].last_log_term_,
                     (context *)
                     (req->log_entries_).
                     super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (function<void_(cornerstone::peer_&)> *)&local_108);
          _Var12._M_pi = _Stack_140._M_pi;
          ppVar7 = local_148;
          local_148 = (peer *)0x0;
          _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&req[5].super_msg_base.dst_;
          *(peer **)&req[5].super_msg_base.type_ = ppVar7;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&req[5].super_msg_base.dst_ =
               _Var12._M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          if (_Stack_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_140._M_pi);
          }
          invite_srv_to_join_cluster((raft_server *)req);
          auVar17 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
          _Var12._M_pi = auVar17._8_8_;
          puVar9[6] = auVar17._0_8_;
          *(undefined1 *)(puVar9 + 7) = 1;
          if (local_f8[0].super_msg_base._vptr_msg_base != (_func_int **)0x0) {
            (*(code *)local_f8[0].super_msg_base._vptr_msg_base)(&local_108,&local_108,3);
            _Var12._M_pi = extraout_RDX_06;
          }
        }
        if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
          _Var12._M_pi = extraout_RDX_07;
        }
      }
      goto LAB_0014e828;
    }
    plVar13 = (long *)req[4].last_log_term_;
    local_108._M_unused._M_object = local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"this is not a leader, cannot handle AddServerRequest","");
    (**(code **)(*plVar13 + 0x18))(plVar13,&local_108);
    _Var12._M_pi = extraout_RDX_01;
  }
  else {
    plVar13 = (long *)req[4].last_log_term_;
    local_108._M_unused._M_object = local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,
               "bad add server request as we are expecting one log entry with value type of ClusterServer"
               ,"");
    (**(code **)(*plVar13 + 0x10))(plVar13,&local_108);
    _Var12._M_pi = extraout_RDX;
  }
  if ((req_msg *)local_108._M_unused._0_8_ != local_f8) {
    operator_delete(local_108._M_unused._M_object,
                    (ulong)((long)local_f8[0].super_msg_base._vptr_msg_base + 1));
    _Var12._M_pi = extraout_RDX_00;
  }
LAB_0014e828:
  pVar16.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  pVar16.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar16.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_add_srv_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries(req.log_entries());
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::add_server_response, id_, leader_));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::cluster_server)
    {
        l_->debug("bad add server request as we are expecting one log entry with value type of ClusterServer");
        return resp;
    }

    if (role_ != srv_role::leader)
    {
        l_->info("this is not a leader, cannot handle AddServerRequest");
        return resp;
    }

    ptr<srv_config> srv_conf(srv_config::deserialize(entries[0]->get_buf()));
    {
        read_lock(peers_lock_);
        if (peers_.find(srv_conf->get_id()) != peers_.end() || id_ == srv_conf->get_id())
        {
            l_->warn(
                lstrfmt("the server to be added has a duplicated id with existing server %d").fmt(srv_conf->get_id()));
            return resp;
        }
    }

    if (config_changing_)
    {
        // the previous config has not committed yet
        l_->info("previous config has not committed yet");
        return resp;
    }

    conf_to_add_ = std::move(srv_conf);
    timer_task<peer&>::executor exec = [this](peer& p) { this->handle_hb_timeout(p); };
    srv_to_join_ = cs_new<peer>(conf_to_add_, *ctx_, exec);
    invite_srv_to_join_cluster();
    resp->accept(log_store_->next_slot());
    return resp;
}